

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_ranges.c
# Opt level: O0

int read_unaligned_addr_check
              (Dwarf_Debug dbg,Dwarf_Addr *addr_out,Dwarf_Small *rangeptr,uint address_size,
              Dwarf_Error *error,Dwarf_Small *section_end)

{
  Dwarf_Byte_Ptr readend;
  Dwarf_Addr _ltmp;
  Dwarf_Addr a;
  Dwarf_Small *section_end_local;
  Dwarf_Error *error_local;
  Dwarf_Small *pDStack_28;
  uint address_size_local;
  Dwarf_Small *rangeptr_local;
  Dwarf_Addr *addr_out_local;
  Dwarf_Debug dbg_local;
  
  _ltmp = 0;
  readend = (Dwarf_Byte_Ptr)0x0;
  a = (Dwarf_Addr)section_end;
  section_end_local = (Dwarf_Small *)error;
  error_local._4_4_ = address_size;
  pDStack_28 = rangeptr;
  rangeptr_local = (Dwarf_Small *)addr_out;
  addr_out_local = &dbg->de_magic;
  if (rangeptr + address_size < rangeptr) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read starts past the end of section");
    dbg_local._4_4_ = 1;
  }
  else if (section_end < rangeptr + address_size) {
    _dwarf_error_string(dbg,error,0x14b,
                        "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section");
    dbg_local._4_4_ = 1;
  }
  else {
    (*dbg->de_copy_word)(&readend,rangeptr,(unsigned_long)address_size);
    *(Dwarf_Byte_Ptr *)rangeptr_local = readend;
    dbg_local._4_4_ = 0;
  }
  return dbg_local._4_4_;
}

Assistant:

static int
read_unaligned_addr_check(Dwarf_Debug dbg,
    Dwarf_Addr *addr_out,
    Dwarf_Small *rangeptr,
    unsigned address_size,
    Dwarf_Error *error,
    Dwarf_Small *section_end)
{
    Dwarf_Addr a = 0;

    READ_UNALIGNED_CK(dbg,a,
        Dwarf_Addr, rangeptr,
        address_size,
        error,section_end);
    *addr_out = a;
    return DW_DLV_OK;
}